

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O1

void __thiscall S98Player::RefreshTSRates(S98Player *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  UINT64 UVar4;
  
  uVar3 = (ulong)(this->_fileHdr).tickMult;
  uVar2 = (ulong)(this->_fileHdr).tickDiv;
  this->_ttMult = uVar3;
  this->_tsDiv = uVar2;
  uVar1 = (this->_playOpts).genOpts.pbSpeed;
  if ((uVar1 & 0xfffeffff) != 0) {
    this->_ttMult = uVar3 << 0x10;
    this->_tsDiv = uVar1 * uVar2;
  }
  UVar4 = (ulong)(this->super_PlayerBase)._outSmplRate * this->_ttMult;
  this->_tsMult = UVar4;
  uVar2 = this->_lastTsMult;
  if ((UVar4 - uVar2 != 0) || (this->_tsDiv != this->_lastTsDiv)) {
    if ((uVar2 != 0) && (this->_lastTsDiv != 0)) {
      this->_playSmpl =
           (UINT32)((((this->_lastTsDiv * (ulong)this->_playSmpl) / uVar2) * UVar4) / this->_tsDiv);
    }
    this->_lastTsMult = UVar4;
    this->_lastTsDiv = this->_tsDiv;
  }
  return;
}

Assistant:

void S98Player::RefreshTSRates(void)
{
	_ttMult = _fileHdr.tickMult;
	_tsDiv = _fileHdr.tickDiv;
	if (_playOpts.genOpts.pbSpeed != 0 && _playOpts.genOpts.pbSpeed != 0x10000)
	{
		_ttMult *= 0x10000;
		_tsDiv *= _playOpts.genOpts.pbSpeed;
	}
	_tsMult = _ttMult * _outSmplRate;
	if (_tsMult != _lastTsMult ||
	    _tsDiv != _lastTsDiv)
	{
		if (_lastTsMult && _lastTsDiv)	// the order * / * / is required to avoid overflow
			_playSmpl = (UINT32)(_playSmpl * _lastTsDiv / _lastTsMult * _tsMult / _tsDiv);
		_lastTsMult = _tsMult;
		_lastTsDiv = _tsDiv;
	}
	return;
}